

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O2

ssize_t __thiscall
uWS::WebSocket<false>::send(WebSocket<false> *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ulong uVar1;
  void *pvVar2;
  OpCode opCode;
  Message *pMVar3;
  size_t sVar4;
  ssize_t sVar5;
  ssize_t extraout_RAX;
  size_t sVar6;
  bool bVar7;
  undefined4 in_register_00000034;
  char *src;
  undefined8 *puVar8;
  uv_poll_t *puVar9;
  undefined4 in_register_00000084;
  _func_void_void_ptr_void_ptr_bool_void_ptr *p_Var10;
  void *in_R9;
  int index;
  bool wasTransferred_1;
  bool wasTransferred;
  void *local_40;
  _func_void_void_ptr_void_ptr_bool_void_ptr *local_38;
  
  p_Var10 = (_func_void_void_ptr_void_ptr_bool_void_ptr *)CONCAT44(in_register_00000084,__flags);
  src = (char *)CONCAT44(in_register_00000034,__fd);
  opCode = (OpCode)__n;
  puVar8 = (undefined8 *)((this->super_Socket).p)->data;
  if (puVar8[4] != 0) {
    pMVar3 = uS::Socket::allocMessage(&this->super_Socket,(long)__buf + 0xe,(char *)0x0);
    sVar4 = WebSocketProtocol<false>::formatMessage
                      (pMVar3->data,src,(size_t)__buf,opCode,(size_t)__buf,false);
    pMVar3->length = sVar4;
    pMVar3->callback = p_Var10;
    pMVar3->callbackData = in_R9;
    pvVar2 = ((this->super_Socket).p)->data;
    pMVar3->nextMessage = (Message *)0x0;
    puVar8 = (undefined8 *)(*(long *)((long)pvVar2 + 0x28) + 0x10);
    if (*(long *)((long)pvVar2 + 0x28) == 0) {
      puVar8 = (undefined8 *)((long)pvVar2 + 0x20);
    }
    *puVar8 = pMVar3;
    *(Message **)((long)pvVar2 + 0x28) = pMVar3;
    return (ssize_t)pvVar2;
  }
  uVar1 = (long)__buf + 0x3e;
  local_40 = in_R9;
  if (uVar1 < 0x401) {
    index = ((int)(uVar1 >> 4) + 1) - (uint)((uVar1 & 0xf) == 0);
    local_38 = p_Var10;
    pMVar3 = (Message *)uS::NodeData::getSmallMemoryBlock((NodeData *)*puVar8,index);
    pMVar3->data = (char *)(pMVar3 + 1);
    sVar6 = __n & 0xff;
    sVar4 = WebSocketProtocol<false>::formatMessage
                      ((char *)(pMVar3 + 1),src,(size_t)__buf,opCode,(size_t)__buf,false);
    pMVar3->length = sVar4;
    sVar5 = uS::Socket::write(&this->super_Socket,(int)pMVar3,&wasTransferred,sVar6);
    if ((char)sVar5 == '\0') {
      if (local_38 == (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
        return 0;
      }
      puVar9 = (this->super_Socket).p;
      bVar7 = true;
    }
    else {
      if (wasTransferred != false) {
        pMVar3->callback = local_38;
LAB_00116004:
        pMVar3->callbackData = local_40;
        return (ssize_t)local_40;
      }
      uS::NodeData::freeSmallMemoryBlock(*((this->super_Socket).p)->data,(char *)pMVar3,index);
      if (local_38 == (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
        return 0;
      }
      puVar9 = (this->super_Socket).p;
      bVar7 = false;
    }
    sVar5 = (*local_38)(puVar9,local_40,bVar7,(void *)0x0);
  }
  else {
    pMVar3 = uS::Socket::allocMessage(&this->super_Socket,(long)__buf + 0xe,(char *)0x0);
    sVar6 = __n & 0xff;
    sVar4 = WebSocketProtocol<false>::formatMessage
                      (pMVar3->data,src,(size_t)__buf,opCode,(size_t)__buf,false);
    pMVar3->length = sVar4;
    sVar5 = uS::Socket::write(&this->super_Socket,(int)pMVar3,&wasTransferred_1,sVar6);
    if ((char)sVar5 == '\0') {
      if (p_Var10 == (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
        return sVar5;
      }
      puVar9 = (this->super_Socket).p;
      bVar7 = true;
    }
    else {
      if (wasTransferred_1 != false) {
        pMVar3->callback = p_Var10;
        goto LAB_00116004;
      }
      operator_delete__(pMVar3);
      if (p_Var10 == (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
        return extraout_RAX;
      }
      puVar9 = (this->super_Socket).p;
      bVar7 = false;
    }
    sVar5 = (*p_Var10)(puVar9,local_40,bVar7,(void *)0x0);
  }
  return sVar5;
}

Assistant:

void WebSocket<isServer>::send(const char *message, size_t length, OpCode opCode, void(*callback)(void *webSocket, void *data, bool cancelled, void *reserved), void *callbackData) {
    const int HEADER_LENGTH = WebSocketProtocol<!isServer>::LONG_MESSAGE_HEADER;

    if (hasEmptyQueue()) {
        if (length + sizeof(uS::SocketData::Queue::Message) + HEADER_LENGTH <= uS::NodeData::preAllocMaxSize) {
            int memoryLength = length + sizeof(uS::SocketData::Queue::Message) + HEADER_LENGTH;
            int memoryIndex = getSocketData()->nodeData->getMemoryBlockIndex(memoryLength);

            uS::SocketData::Queue::Message *messagePtr = (uS::SocketData::Queue::Message *) getSocketData()->nodeData->getSmallMemoryBlock(memoryIndex);
            messagePtr->data = ((char *) messagePtr) + sizeof(uS::SocketData::Queue::Message);
            messagePtr->length = WebSocketProtocol<isServer>::formatMessage((char *) messagePtr->data, message, length, opCode, length, false);

            bool wasTransferred;
            if (write(messagePtr, wasTransferred)) {
                if (!wasTransferred) {
                    getSocketData()->nodeData->freeSmallMemoryBlock((char *) messagePtr, memoryIndex);
                    if (callback) {
                        callback(*this, callbackData, false, nullptr);
                    }
                } else {
                    messagePtr->callback = callback;
                    messagePtr->callbackData = callbackData;
                }
            } else {
                if (callback) {
                    callback(*this, callbackData, true, nullptr);
                }
            }
        } else {
            uS::SocketData::Queue::Message *messagePtr = allocMessage(length + HEADER_LENGTH);
            messagePtr->length = WebSocketProtocol<isServer>::formatMessage((char *) messagePtr->data, message, length, opCode, length, false);
            bool wasTransferred;
            if (write(messagePtr, wasTransferred)) {
                if (!wasTransferred) {
                    freeMessage(messagePtr);
                    if (callback) {
                        callback(*this, callbackData, false, nullptr);
                    }
                } else {
                    messagePtr->callback = callback;
                    messagePtr->callbackData = callbackData;
                }
            } else {
                if (callback) {
                    callback(*this, callbackData, true, nullptr);
                }
            }
        }
    } else {
        uS::SocketData::Queue::Message *messagePtr = allocMessage(length + HEADER_LENGTH);
        messagePtr->length = WebSocketProtocol<isServer>::formatMessage((char *) messagePtr->data, message, length, opCode, length, false);
        messagePtr->callback = callback;
        messagePtr->callbackData = callbackData;
        enqueue(messagePtr);
    }
}